

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Registry *this,Network *aRet)

{
  int iVar1;
  Status SVar2;
  NetworkId networkId;
  NetworkId local_84;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  char local_68 [16];
  undefined6 local_58;
  undefined2 uStack_52;
  undefined6 uStack_50;
  _Alloc_hider local_48;
  char local_38 [16];
  int local_28;
  
  if (this->mStorage == (PersistentStorage *)0x0) {
    __assert_fail("mStorage != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/registry.cpp"
                  ,0x23c,
                  "Registry::Status ot::commissioner::persistent_storage::Registry::GetCurrentNetwork(Network &)"
                 );
  }
  NetworkId::NetworkId(&local_84);
  iVar1 = (*this->mStorage->_vptr_PersistentStorage[0x1d])(this->mStorage,&local_84);
  SVar2 = kError;
  if ((char)iVar1 == '\0') {
    if (local_84.mId == 0xffffffff) {
      Network::Network((Network *)local_80);
      aRet->mId = (NetworkId)local_80._0_4_;
      aRet->mDomainId = (DomainId)local_80._4_4_;
      std::__cxx11::string::operator=((string *)&aRet->mName,(string *)&local_78);
      aRet->mXpan = CONCAT26(uStack_52,local_58);
      *(ulong *)((long)&aRet->mXpan + 6) = CONCAT62(uStack_50,uStack_52);
      std::__cxx11::string::operator=((string *)&aRet->mMlp,(string *)&local_48);
      aRet->mCcm = local_28;
      SVar2 = kSuccess;
    }
    else {
      iVar1 = (*this->mStorage->_vptr_PersistentStorage[0xe])(this->mStorage,&local_84,aRet);
      SVar2 = kNotFound;
      if ((char)iVar1 != '\x01') {
        SVar2 = ((char)iVar1 != '\0') << 2;
      }
    }
    if (local_84.mId == 0xffffffff) {
      if (local_48._M_p != local_38) {
        operator_delete(local_48._M_p);
      }
      if (local_78._M_p != local_68) {
        operator_delete(local_78._M_p);
      }
    }
  }
  return SVar2;
}

Assistant:

Registry::Status Registry::GetCurrentNetwork(Network &aRet)
{
    assert(mStorage != nullptr);
    NetworkId networkId;
    if (MapStatus(mStorage->GetCurrentNetwork(networkId)) != Registry::Status::kSuccess)
    {
        return Registry::Status::kError;
    }

    return (networkId.mId == EMPTY_ID) ? (aRet = Network{}, Registry::Status::kSuccess)
                                       : MapStatus(mStorage->Get(networkId, aRet));
}